

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_concat.cpp
# Opt level: O1

void duckdb::MapConcatFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulong *puVar1;
  pointer pVVar2;
  pointer pVVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  element_type *peVar10;
  bool bVar11;
  TemplatedValidityData<unsigned_long> *pTVar12;
  reference pvVar13;
  reference pvVar14;
  __normal_iterator<duckdb::Value_*,_std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>_>
  _Var15;
  long lVar16;
  ulong uVar17;
  size_type *psVar18;
  size_type *psVar19;
  idx_t iVar20;
  Vector *this_00;
  Value *list_entry;
  size_type sVar21;
  long lVar22;
  Value *pVVar23;
  ulong uVar24;
  size_type sVar25;
  size_type *psVar26;
  size_type *psVar27;
  vector<duckdb::Value,_true> keys_list;
  vector<duckdb::Value,_true> values_list;
  vector<duckdb::Value,_true> list_entries;
  vector<duckdb::UnifiedVectorFormat,_true> map_formats;
  size_type *local_168;
  long local_158;
  Value *pVStack_150;
  undefined8 local_148;
  idx_t local_140;
  size_type local_138;
  DataChunk *local_130;
  size_type *local_128;
  idx_t local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  Value local_f8;
  data_ptr_t local_b0;
  pointer local_a8;
  pointer local_a0;
  long local_98;
  long local_90;
  Vector *local_88;
  vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_> local_80;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  long local_48;
  Value *pVStack_40;
  undefined8 local_38;
  
  if ((result->type).id_ == SQLNULL) {
    FlatVector::VerifyFlatVector(result);
    if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      local_80.
      super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)(result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_f8,(unsigned_long *)&local_80);
      peVar10 = local_f8.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar6 = local_f8.type_._0_8_;
      local_f8.type_._0_8_ = (Value *)0x0;
      local_f8.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar6;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar10;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if ((Value *)local_f8.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (Value *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_f8.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)
           (pTVar12->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    *puVar1 = *puVar1 & 0xfffffffffffffffe;
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  else {
    local_140 = args->count;
    pVVar2 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar3 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_138 = ((long)pVVar3 - (long)pVVar2 >> 3) * 0x4ec4ec4ec4ec4ec5;
    ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::vector
              (&local_80,local_138,(allocator_type *)&local_f8);
    local_a8 = pVVar3;
    local_a0 = pVVar2;
    if (pVVar3 != pVVar2) {
      sVar25 = local_138 + (local_138 == 0);
      sVar21 = 0;
      do {
        pvVar13 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar21);
        pvVar14 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                            ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_80,sVar21);
        Vector::ToUnifiedFormat(pvVar13,local_140,pvVar14);
        sVar21 = sVar21 + 1;
      } while (sVar25 != sVar21);
    }
    local_130 = args;
    if (local_140 != 0) {
      local_b0 = result->data;
      local_138 = local_138 + (local_138 == 0);
      iVar20 = 0;
      do {
        local_158 = 0;
        pVStack_150 = (Value *)0x0;
        local_148 = 0;
        local_120 = iVar20;
        if (local_a8 == local_a0) {
          bVar11 = true;
          psVar26 = (size_type *)0x0;
          local_168 = (size_type *)0x0;
        }
        else {
          bVar11 = true;
          sVar21 = 0;
          local_168 = (size_type *)0x0;
          psVar26 = (size_type *)0x0;
          local_128 = (size_type *)0x0;
          do {
            pvVar13 = vector<duckdb::Vector,_true>::operator[](&local_130->data,sVar21);
            if ((pvVar13->type).id_ != SQLNULL) {
              pvVar14 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                                  ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_80,sVar21);
              psVar4 = pvVar14->sel->sel_vector;
              iVar20 = local_120;
              if (psVar4 != (sel_t *)0x0) {
                iVar20 = (idx_t)psVar4[local_120];
              }
              puVar5 = (pvVar14->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if ((puVar5 == (unsigned_long *)0x0) ||
                 ((puVar5[iVar20 >> 6] >> (iVar20 & 0x3f) & 1) != 0)) {
                pvVar13 = vector<duckdb::Vector,_true>::operator[](&local_130->data,sVar21);
                local_88 = MapVector::GetKeys(pvVar13);
                local_90 = *(long *)(pvVar14->data + iVar20 * 0x10 + 8);
                if (local_90 == 0) {
                  bVar11 = false;
                }
                else {
                  local_98 = *(long *)(pvVar14->data + iVar20 * 0x10);
                  lVar22 = 0;
                  do {
                    iVar20 = lVar22 + local_98;
                    Vector::GetValue(&local_f8,local_88,iVar20);
                    _Var15 = ::std::
                             __find_if<__gnu_cxx::__normal_iterator<duckdb::Value*,std::vector<duckdb::Value,std::allocator<duckdb::Value>>>,__gnu_cxx::__ops::_Iter_equals_val<duckdb::Value_const>>
                                       (local_158,pVStack_150,&local_f8);
                    if (_Var15._M_current == pVStack_150) {
                      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_158
                                 ,&local_f8);
                      if (psVar26 == local_128) {
                        if ((long)psVar26 - (long)local_168 == 0x7ffffffffffffff0) {
                          ::std::__throw_length_error("vector::_M_realloc_insert");
                        }
                        uVar24 = (long)psVar26 - (long)local_168 >> 4;
                        uVar17 = uVar24;
                        if (psVar26 == local_168) {
                          uVar17 = 1;
                        }
                        local_128 = (size_type *)(uVar17 + uVar24);
                        if (0x7fffffffffffffe < local_128) {
                          local_128 = (size_type *)0x7ffffffffffffff;
                        }
                        if (CARRY8(uVar17,uVar24)) {
                          local_128 = (size_type *)0x7ffffffffffffff;
                        }
                        if (local_128 == (size_type *)0x0) {
                          psVar18 = (size_type *)0x0;
                        }
                        else {
                          psVar18 = (size_type *)operator_new((long)local_128 << 4);
                        }
                        psVar18[uVar24 * 2] = sVar21;
                        psVar18[uVar24 * 2 + 1] = iVar20;
                        psVar27 = psVar18;
                        for (psVar19 = local_168; psVar26 != psVar19; psVar19 = psVar19 + 2) {
                          sVar25 = psVar19[1];
                          *psVar27 = *psVar19;
                          psVar27[1] = sVar25;
                          psVar27 = psVar27 + 2;
                        }
                        if (local_168 != (size_type *)0x0) {
                          operator_delete(local_168);
                        }
                        psVar26 = psVar27 + 2;
                        local_128 = psVar18 + (long)local_128 * 2;
                        local_168 = psVar18;
                      }
                      else {
                        *psVar26 = sVar21;
                        psVar26[1] = iVar20;
                        psVar26 = psVar26 + 2;
                      }
                    }
                    else {
                      lVar16 = (long)_Var15._M_current - local_158 >> 2;
                      *(idx_t *)((long)local_168 + lVar16 + 8) = iVar20;
                      *(size_type *)((long)local_168 + lVar16) = sVar21;
                    }
                    Value::~Value(&local_f8);
                    lVar22 = lVar22 + 1;
                  } while (lVar22 != local_90);
                  bVar11 = false;
                }
              }
            }
            sVar21 = sVar21 + 1;
          } while (sVar21 != local_138);
        }
        iVar20 = ListVector::GetListSize(result);
        *(idx_t *)(local_b0 + local_120 * 0x10) = iVar20;
        *(long *)((long)(local_b0 + local_120 * 0x10) + 8) = (long)pVStack_150 - local_158 >> 6;
        if (bVar11) {
          FlatVector::SetNull(result,local_120,true);
        }
        else {
          local_118 = 0;
          uStack_110 = 0;
          local_108 = 0;
          uVar6 = local_118;
          uVar7 = uStack_110;
          uVar8 = local_108;
          lVar22 = local_158;
          pVVar23 = pVStack_150;
          uVar9 = local_148;
          for (psVar18 = local_168; psVar18 != psVar26; psVar18 = psVar18 + 2) {
            local_158 = lVar22;
            pVStack_150 = pVVar23;
            local_148 = uVar9;
            local_118 = uVar6;
            uStack_110 = uVar7;
            local_108 = uVar8;
            pvVar13 = vector<duckdb::Vector,_true>::operator[](&local_130->data,*psVar18);
            this_00 = MapVector::GetValues(pvVar13);
            Vector::GetValue(&local_f8,this_00,psVar18[1]);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
            emplace_back<duckdb::Value>
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_118,&local_f8
                      );
            Value::~Value(&local_f8);
            uVar6 = local_118;
            uVar7 = uStack_110;
            uVar8 = local_108;
            lVar22 = local_158;
            pVVar23 = pVStack_150;
            uVar9 = local_148;
          }
          local_158 = 0;
          pVStack_150 = (Value *)0x0;
          local_148 = 0;
          local_118 = 0;
          uStack_110 = 0;
          local_108 = 0;
          local_68 = uVar6;
          uStack_60 = uVar7;
          local_58 = uVar8;
          local_48 = lVar22;
          pVStack_40 = pVVar23;
          local_38 = uVar9;
          GetListEntries((vector<duckdb::Value,_true> *)&local_f8,
                         (vector<duckdb::Value,_true> *)&local_48,
                         (vector<duckdb::Value,_true> *)&local_68);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_68);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_48);
          peVar10 = local_f8.type_.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          for (pVVar23 = (Value *)local_f8.type_._0_8_; pVVar23 != (Value *)peVar10;
              pVVar23 = pVVar23 + 1) {
            ListVector::PushBack(result,pVVar23);
          }
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f8);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_118);
        }
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_158);
        if (local_168 != (size_type *)0x0) {
          operator_delete(local_168);
        }
        iVar20 = local_120 + 1;
      } while (iVar20 != local_140);
    }
    bVar11 = DataChunk::AllConstant(local_130);
    if (bVar11) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
    Vector::Verify(result,local_140);
    ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::
    ~vector(&local_80);
  }
  return;
}

Assistant:

static void MapConcatFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (result.GetType().id() == LogicalTypeId::SQLNULL) {
		// All inputs are NULL, just return NULL
		auto &validity = FlatVector::Validity(result);
		validity.SetInvalid(0);
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		return;
	}
	D_ASSERT(result.GetType().id() == LogicalTypeId::MAP);
	auto count = args.size();

	auto map_count = args.ColumnCount();
	vector<UnifiedVectorFormat> map_formats(map_count);
	for (idx_t i = 0; i < map_count; i++) {
		auto &map = args.data[i];
		map.ToUnifiedFormat(count, map_formats[i]);
	}
	auto result_data = FlatVector::GetData<list_entry_t>(result);

	for (idx_t i = 0; i < count; i++) {
		// Loop through all the maps per list
		// we cant do better because all the entries of the child vector have to be contiguous
		// so we cant start the next row before we have finished the one before it
		auto &result_entry = result_data[i];
		vector<MapKeyIndexPair> index_to_map;
		vector<Value> keys_list;
		bool all_null = true;
		for (idx_t map_idx = 0; map_idx < map_count; map_idx++) {
			if (args.data[map_idx].GetType().id() == LogicalTypeId::SQLNULL) {
				continue;
			}

			auto &map_format = map_formats[map_idx];
			auto index = map_format.sel->get_index(i);
			if (!map_format.validity.RowIsValid(index)) {
				continue;
			}

			all_null = false;
			auto &keys = MapVector::GetKeys(args.data[map_idx]);
			auto entry = UnifiedVectorFormat::GetData<list_entry_t>(map_format)[index];

			// Update the list for this row
			for (idx_t list_idx = 0; list_idx < entry.length; list_idx++) {
				auto key_index = entry.offset + list_idx;
				auto key = keys.GetValue(key_index);
				auto entry = std::find(keys_list.begin(), keys_list.end(), key);
				if (entry == keys_list.end()) {
					// Result list does not contain this value yet
					keys_list.push_back(key);
					index_to_map.emplace_back(map_idx, key_index);
				} else {
					// Result list already contains this, update where to find the value at
					auto distance = std::distance(keys_list.begin(), entry);
					auto &mapping = *(index_to_map.begin() + distance);
					mapping.key_index = key_index;
					mapping.map_index = map_idx;
				}
			}
		}

		result_entry.offset = ListVector::GetListSize(result);
		result_entry.length = keys_list.size();
		if (all_null) {
			D_ASSERT(keys_list.empty() && index_to_map.empty());
			FlatVector::SetNull(result, i, true);
			continue;
		}

		vector<Value> values_list;
		D_ASSERT(keys_list.size() == index_to_map.size());
		// Get the values from the mapping
		for (auto &mapping : index_to_map) {
			auto &map = args.data[mapping.map_index];
			auto &values = MapVector::GetValues(map);
			values_list.push_back(values.GetValue(mapping.key_index));
		}
		D_ASSERT(values_list.size() == keys_list.size());
		auto list_entries = GetListEntries(std::move(keys_list), std::move(values_list));
		for (auto &list_entry : list_entries) {
			ListVector::PushBack(result, list_entry);
		}
	}

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
	result.Verify(count);
}